

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.h
# Opt level: O0

uint8_t * ptls_encode_quicint(uint8_t *p,uint64_t v)

{
  byte *pbVar1;
  ulong in_RSI;
  byte *in_RDI;
  uint sb;
  int local_14;
  byte *local_8;
  
  local_8 = in_RDI;
  if (0x3f < in_RSI) {
    if (in_RSI < 0x4000) {
      *in_RDI = (byte)(in_RSI >> 8) | 0x40;
      local_8 = in_RDI + 1;
    }
    else {
      if (in_RSI < 0x40000000) {
        *in_RDI = (byte)(in_RSI >> 0x18) | 0x80;
        local_14 = 0x10;
      }
      else {
        if (0x3fffffffffffffff < in_RSI) {
          __assert_fail("v <= 4611686018427387903",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/include/picotls.h"
                        ,0x5ab,"uint8_t *ptls_encode_quicint(uint8_t *, uint64_t)");
        }
        *in_RDI = (byte)(in_RSI >> 0x38) | 0xc0;
        local_14 = 0x30;
      }
      local_8 = in_RDI + 1;
      do {
        pbVar1 = local_8 + 1;
        *local_8 = (byte)(in_RSI >> ((byte)local_14 & 0x3f));
        local_14 = local_14 + -8;
        local_8 = pbVar1;
      } while (local_14 != 0);
    }
  }
  *local_8 = (byte)in_RSI;
  return local_8 + 1;
}

Assistant:

inline uint8_t *ptls_encode_quicint(uint8_t *p, uint64_t v)
{
    if (PTLS_UNLIKELY(v > 63)) {
        if (PTLS_UNLIKELY(v > 16383)) {
            unsigned sb;
            if (PTLS_UNLIKELY(v > 1073741823)) {
                assert(v <= 4611686018427387903);
                *p++ = 0xc0 | (uint8_t)(v >> 56);
                sb = 6 * 8;
            } else {
                *p++ = 0x80 | (uint8_t)(v >> 24);
                sb = 2 * 8;
            }
            do {
                *p++ = (uint8_t)(v >> sb);
            } while ((sb -= 8) != 0);
        } else {
            *p++ = 0x40 | (uint8_t)((uint16_t)v >> 8);
        }
    }
    *p++ = (uint8_t)v;
    return p;
}